

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  long in_RSI;
  int in_EDI;
  uint8_t *in;
  uint8_t *data_00;
  char *file_name;
  uint8_t *src1;
  float fVar7;
  double data_size_00;
  int range;
  int n;
  size_t data_size;
  uint8_t *data;
  char *output;
  char *name2;
  char *name1;
  int use_gray;
  int scale;
  int keep_alpha;
  int help;
  int c;
  int type;
  float disto [5];
  int ret;
  size_t size2;
  size_t size1;
  WebPPicture pic2;
  WebPPicture pic1;
  int in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  int in_stack_fffffffffffffd44;
  uint in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd60;
  WebPPicture *in_stack_fffffffffffffd68;
  int stride1;
  char *in_stack_fffffffffffffd70;
  float fVar8;
  uint in_stack_fffffffffffffd80;
  uint8_t *src1_00;
  long local_268;
  long lVar9;
  long lVar10;
  uint32_t background_rgb;
  int iVar11;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  uint local_224;
  int local_210;
  int local_110;
  int local_108;
  int local_104;
  float *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  WebPPicture *in_stack_ffffffffffffffa0;
  WebPPicture *in_stack_ffffffffffffffa8;
  
  local_224 = 1;
  iVar11 = 0;
  background_rgb = 0;
  bVar1 = false;
  bVar2 = false;
  lVar10 = 0;
  lVar9 = 0;
  local_268 = 0;
  iVar3 = WebPPictureInit((WebPPicture *)0x10365d);
  if ((iVar3 == 0) || (iVar3 = WebPPictureInit((WebPPicture *)0x10366f), iVar3 == 0)) {
    fprintf(stderr,"Can\'t init pictures\n");
    return 1;
  }
  for (iVar3 = 1; iVar4 = (int)((ulong)in_stack_fffffffffffffd60 >> 0x20), iVar3 < in_EDI;
      iVar3 = iVar3 + 1) {
    iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-ssim");
    if (iVar4 == 0) {
      iVar11 = 1;
    }
    else {
      iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-psnr");
      if (iVar4 == 0) {
        iVar11 = 0;
      }
      else {
        iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-alpha");
        if (iVar4 == 0) {
          bVar1 = true;
        }
        else {
          iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-scale");
          if (iVar4 != 0) {
            iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-gray");
            if (iVar4 == 0) {
              bVar2 = true;
            }
            else {
              iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-h");
              if (iVar4 == 0) {
                background_rgb = 1;
                local_224 = 0;
              }
              else {
                iVar4 = strcmp(*(char **)(in_RSI + (long)iVar3 * 8),"-o");
                if (iVar4 == 0) {
                  iVar4 = iVar3 + 1;
                  if (iVar4 == in_EDI) {
                    fprintf(stderr,"missing file name after %s option.\n",
                            *(undefined8 *)(in_RSI + (long)iVar3 * 8));
                    goto LAB_00103d8b;
                  }
                  local_268 = *(long *)(in_RSI + (long)iVar4 * 8);
                  iVar3 = iVar4;
                }
                else if (lVar10 == 0) {
                  lVar10 = *(long *)(in_RSI + (long)iVar3 * 8);
                }
                else {
                  lVar9 = *(long *)(in_RSI + (long)iVar3 * 8);
                }
              }
            }
          }
        }
      }
    }
  }
  if (((background_rgb == 0) && (lVar10 != 0)) && (lVar9 != 0)) {
    sVar5 = ReadPicture(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,iVar4);
    sVar6 = ReadPicture(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,iVar4);
    if ((sVar5 != 0) && (sVar6 != 0)) {
      if (!bVar1) {
        WebPBlendAlpha((WebPPicture *)CONCAT44(iVar11,iVar3),background_rgb);
        WebPBlendAlpha((WebPPicture *)CONCAT44(iVar11,iVar3),background_rgb);
      }
      iVar3 = WebPPictureDistortion
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90);
      if (iVar3 == 0) {
        fprintf(stderr,"Error while computing the distortion.\n");
      }
      else {
        iVar3 = (int)sVar5;
        in = (uint8_t *)(double)local_228;
        data_size_00 = (double)local_238;
        data_00 = (uint8_t *)(double)local_234;
        file_name = (char *)(double)local_230;
        src1 = (uint8_t *)(double)local_22c;
        fVar7 = (float)(long)sVar5;
        fVar8 = (float)sVar5;
        printf("%u %.2f    %.2f %.2f %.2f %.2f [ %.2f bpp ]\n",in,data_size_00,data_00,file_name,
               src1,(double)(((fVar8 * 8.0) / (float)local_108) / (float)local_104),
               sVar5 & 0xffffffff);
        if (local_268 != 0) {
          src1_00 = (uint8_t *)0x0;
          if (local_110 != local_210) {
            fprintf(stderr,
                    "Pictures are not in the same argb format. Can\'t save the difference map.\n");
            goto LAB_00103d8b;
          }
          if (local_110 == 0) {
            fprintf(stderr,"Can only compute the difference map in ARGB format.\n");
            goto LAB_00103d8b;
          }
          fprintf(stderr,"max differences per channel: ");
          for (iVar4 = 0; iVar4 < 3; iVar4 = iVar4 + 1) {
            stride1 = (int)((ulong)file_name >> 0x20);
            in_stack_fffffffffffffd38 = local_104;
            if (iVar11 == 1) {
              in_stack_fffffffffffffd48 =
                   SSIMScaleChannel(src1_00,iVar4,(uint8_t *)CONCAT44(fVar8,fVar7),
                                    (int)((ulong)src1 >> 0x20),(int)src1,stride1,(int)lVar9,
                                    (int)lVar10);
            }
            else {
              in_stack_fffffffffffffd48 =
                   DiffScaleChannel(src1,stride1,data_00,(int)((ulong)data_size_00 >> 0x20),
                                    SUB84(data_size_00,0),(int)((ulong)in >> 0x20),
                                    in_stack_fffffffffffffd80,(int)src1_00);
            }
            in_stack_fffffffffffffd80 = in_stack_fffffffffffffd48;
            if ((int)in_stack_fffffffffffffd48 < 0) {
              fprintf(stderr,"\nError computing diff map\n");
            }
            fprintf(stderr,"[%d]",(ulong)in_stack_fffffffffffffd80);
          }
          fprintf(stderr,"\n");
          if (bVar2) {
            ConvertToGray((WebPPicture *)&local_110);
          }
          sVar5 = WebPEncodeLosslessBGRA
                            (in,iVar3,in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
                             (uint8_t **)
                             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          if (sVar5 == 0) {
            fprintf(stderr,"Error during lossless encoding.\n");
            goto LAB_00103d8b;
          }
          iVar3 = ImgIoUtilWriteFile(file_name,data_00,(size_t)data_size_00);
          local_224 = (uint)(iVar3 == 0);
          WebPFree((void *)0x103d72);
          if (local_224 != 0) goto LAB_00103d8b;
        }
        local_224 = 0;
      }
    }
  }
  else {
    if (background_rgb == 0) {
      fprintf(stderr,"Error: missing arguments.\n");
    }
    Help();
  }
LAB_00103d8b:
  WebPPictureFree((WebPPicture *)0x103d98);
  WebPPictureFree((WebPPicture *)0x103da5);
  return local_224;
}

Assistant:

int main(int argc, const char* argv[]) {
  WebPPicture pic1, pic2;
  size_t size1 = 0, size2 = 0;
  int ret = EXIT_FAILURE;
  float disto[5];
  int type = 0;
  int c;
  int help = 0;
  int keep_alpha = 0;
  int scale = 0;
  int use_gray = 0;
  const char* name1 = NULL;
  const char* name2 = NULL;
  const char* output = NULL;

  INIT_WARGV(argc, argv);

  if (!WebPPictureInit(&pic1) || !WebPPictureInit(&pic2)) {
    fprintf(stderr, "Can't init pictures\n");
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-ssim")) {
      type = 1;
    } else if (!strcmp(argv[c], "-psnr")) {
      type = 0;
    } else if (!strcmp(argv[c], "-alpha")) {
      keep_alpha = 1;
    } else if (!strcmp(argv[c], "-scale")) {
      scale = 1;
    } else if (!strcmp(argv[c], "-gray")) {
      use_gray = 1;
    } else if (!strcmp(argv[c], "-h")) {
      help = 1;
      ret = EXIT_SUCCESS;
    } else if (!strcmp(argv[c], "-o")) {
      if (++c == argc) {
        fprintf(stderr, "missing file name after %s option.\n", argv[c - 1]);
        goto End;
      }
      output = (const char*)GET_WARGV(argv, c);
    } else if (name1 == NULL) {
      name1 = (const char*)GET_WARGV(argv, c);
    } else {
      name2 = (const char*)GET_WARGV(argv, c);
    }
  }
  if (help || name1 == NULL || name2 == NULL) {
    if (!help) {
      fprintf(stderr, "Error: missing arguments.\n");
    }
    Help();
    goto End;
  }
  size1 = ReadPicture(name1, &pic1, 1);
  size2 = ReadPicture(name2, &pic2, 1);
  if (size1 == 0 || size2 == 0) goto End;

  if (!keep_alpha) {
    WebPBlendAlpha(&pic1, 0x00000000);
    WebPBlendAlpha(&pic2, 0x00000000);
  }

  if (!WebPPictureDistortion(&pic1, &pic2, type, disto)) {
    fprintf(stderr, "Error while computing the distortion.\n");
    goto End;
  }
  printf("%u %.2f    %.2f %.2f %.2f %.2f [ %.2f bpp ]\n",
         (unsigned int)size1,
         disto[4], disto[0], disto[1], disto[2], disto[3],
         8.f * size1 / pic1.width / pic1.height);

  if (output != NULL) {
    uint8_t* data = NULL;
    size_t data_size = 0;
    if (pic1.use_argb != pic2.use_argb) {
      fprintf(stderr, "Pictures are not in the same argb format. "
                      "Can't save the difference map.\n");
      goto End;
    }
    if (pic1.use_argb) {
      int n;
      fprintf(stderr, "max differences per channel: ");
      for (n = 0; n < 3; ++n) {    // skip the alpha channel
        const int range = (type == 1) ?
          SSIMScaleChannel((uint8_t*)pic1.argb + n, pic1.argb_stride * 4,
                           (const uint8_t*)pic2.argb + n, pic2.argb_stride * 4,
                           4, pic1.width, pic1.height, scale) :
          DiffScaleChannel((uint8_t*)pic1.argb + n, pic1.argb_stride * 4,
                           (const uint8_t*)pic2.argb + n, pic2.argb_stride * 4,
                           4, pic1.width, pic1.height, scale);
        if (range < 0) fprintf(stderr, "\nError computing diff map\n");
        fprintf(stderr, "[%d]", range);
      }
      fprintf(stderr, "\n");
      if (use_gray) ConvertToGray(&pic1);
    } else {
      fprintf(stderr, "Can only compute the difference map in ARGB format.\n");
      goto End;
    }
#if !defined(WEBP_REDUCE_CSP)
    data_size = WebPEncodeLosslessBGRA((const uint8_t*)pic1.argb,
                                       pic1.width, pic1.height,
                                       pic1.argb_stride * 4,
                                       &data);
    if (data_size == 0) {
      fprintf(stderr, "Error during lossless encoding.\n");
      goto End;
    }
    ret = ImgIoUtilWriteFile(output, data, data_size) ? EXIT_SUCCESS
                                                      : EXIT_FAILURE;
    WebPFree(data);
    if (ret) goto End;
#else
    (void)data;
    (void)data_size;
    fprintf(stderr, "Cannot save the difference map. Please recompile "
                    "without the WEBP_REDUCE_CSP flag.\n");
    goto End;
#endif  // WEBP_REDUCE_CSP
  }
  ret = EXIT_SUCCESS;

 End:
  WebPPictureFree(&pic1);
  WebPPictureFree(&pic2);
  FREE_WARGV_AND_RETURN(ret);
}